

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_vectors.h
# Opt level: O1

void __thiscall
Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>::
compute_average(Vector_distances_in_diagram<Gudhi::Euclidean_distance> *this,
               vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*>_>
               *to_average)

{
  pointer ppVVar1;
  Vector_distances_in_diagram<Gudhi::Euclidean_distance> *pVVar2;
  pointer ppVVar3;
  pointer pdVar4;
  long lVar5;
  ulong uVar6;
  size_t i;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  vector<double,_std::allocator<double>_> av;
  allocator_type local_79;
  vector<double,_std::allocator<double>_> local_78;
  void *pvStack_60;
  undefined8 local_58;
  long lStack_50;
  size_t local_48;
  size_t sStack_40;
  size_t local_38;
  value_type_conflict1 local_30;
  
  ppVVar1 = (to_average->
            super__Vector_base<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(to_average->
                super__Vector_base<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1;
  if (lVar5 == 0) {
    local_58 = 0;
    lStack_50 = 0;
    local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    pvStack_60 = (void *)0x0;
    local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
    _M_move_assign(&this->intervals);
    std::vector<double,_std::allocator<double>_>::_M_move_assign
              (&this->sorted_vector_of_distances,&pvStack_60);
    this->where_to_cut = local_38;
    this->number_of_functions_for_vectorization = local_48;
    this->number_of_functions_for_projections_to_reals = sStack_40;
    if (pvStack_60 != (void *)0x0) {
      operator_delete(pvStack_60,lStack_50 - (long)pvStack_60);
    }
  }
  else {
    lVar7 = 0;
    uVar6 = 0;
    do {
      uVar12 = uVar6;
      pVVar2 = ppVVar1[lVar7];
      uVar11 = (long)*(pointer *)
                      ((long)&(pVVar2->sorted_vector_of_distances).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl + 8) -
               *(long *)&(pVVar2->sorted_vector_of_distances).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data >> 3;
      uVar6 = uVar12;
      if (uVar12 < uVar11) {
        uVar6 = uVar11;
      }
      lVar7 = lVar7 + 1;
    } while (lVar5 >> 3 != lVar7);
    local_30 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector(&local_78,uVar6,&local_30,&local_79);
    ppVVar1 = (to_average->
              super__Vector_base<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppVVar3 = (to_average->
              super__Vector_base<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    lVar5 = (long)ppVVar3 - (long)ppVVar1;
    lVar7 = lVar5 >> 3;
    if (ppVVar3 != ppVVar1) {
      lVar8 = 0;
      do {
        pdVar4 = (ppVVar1[lVar8]->sorted_vector_of_distances).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        lVar9 = (long)(ppVVar1[lVar8]->sorted_vector_of_distances).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar4;
        if (lVar9 != 0) {
          lVar10 = 0;
          do {
            local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar10] =
                 pdVar4[lVar10] +
                 local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10];
            lVar10 = lVar10 + 1;
          } while (lVar9 >> 3 != lVar10);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != lVar7);
    }
    if (uVar6 != 0) {
      auVar13._8_4_ = (int)(lVar5 >> 0x23);
      auVar13._0_8_ = lVar7;
      auVar13._12_4_ = 0x45300000;
      if (uVar11 < uVar12) {
        uVar11 = uVar12;
      }
      uVar6 = 0;
      do {
        local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar6] =
             local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar6] /
             ((auVar13._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0));
        uVar6 = uVar6 + 1;
      } while (uVar11 != uVar6);
    }
    std::vector<double,_std::allocator<double>_>::operator=
              (&this->sorted_vector_of_distances,&local_78);
    this->where_to_cut =
         (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start >> 3;
  }
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Vector_distances_in_diagram<F>::compute_average(const std::vector<Vector_distances_in_diagram*>& to_average) {
  if (to_average.size() == 0) {
    (*this) = Vector_distances_in_diagram<F>();
    return;
  }

  size_t maximal_length_of_vector = 0;
  for (size_t i = 0; i != to_average.size(); ++i) {
    if (to_average[i]->sorted_vector_of_distances.size() > maximal_length_of_vector) {
      maximal_length_of_vector = to_average[i]->sorted_vector_of_distances.size();
    }
  }

  std::vector<double> av(maximal_length_of_vector, 0);
  for (size_t i = 0; i != to_average.size(); ++i) {
    for (size_t j = 0; j != to_average[i]->sorted_vector_of_distances.size(); ++j) {
      av[j] += to_average[i]->sorted_vector_of_distances[j];
    }
  }

  for (size_t i = 0; i != maximal_length_of_vector; ++i) {
    av[i] /= static_cast<double>(to_average.size());
  }
  this->sorted_vector_of_distances = av;
  this->where_to_cut = av.size();
}